

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngframe.cpp
# Opt level: O2

void __thiscall
apngasm::APNGFrame::APNGFrame(APNGFrame *this,string *filePath,uint delayNum,uint delayDen)

{
  int *piVar1;
  int *piVar2;
  uchar uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  size_t sVar7;
  png_structp ppVar8;
  __jmp_buf_tag *__env;
  long lVar9;
  uchar *puVar10;
  uchar **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  png_structp png_ptr;
  png_infop info_ptr;
  png_color_16p trans_color;
  png_bytep trans_alpha;
  png_colorp palette;
  uchar sig [8];
  
  this->_paletteSize = 0;
  this->_transparencySize = 0;
  this->_pixels = (uchar *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_colorType = '\0';
  this->_delayNum = delayNum;
  this->_delayDen = delayDen;
  this->_rows = (uchar **)0x0;
  __stream = fopen((filePath->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  sVar7 = fread(sig,1,8,__stream);
  if ((sVar7 != 8) || (iVar5 = png_sig_cmp(sig,0,8), iVar5 != 0)) goto LAB_0016a82f;
  ppVar8 = (png_structp)png_create_read_struct("1.6.37",0,0);
  png_ptr = ppVar8;
  info_ptr = (png_infop)png_create_info_struct(ppVar8);
  if (info_ptr != (png_infop)0x0 && ppVar8 != (png_structp)0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar8,longjmp,200);
    iVar5 = _setjmp(__env);
    if (iVar5 == 0) {
      piVar1 = &this->_paletteSize;
      png_init_io(png_ptr,__stream);
      png_set_sig_bytes(png_ptr,8);
      png_read_info(png_ptr,info_ptr);
      uVar6 = png_get_image_width(png_ptr,info_ptr);
      this->_width = uVar6;
      uVar6 = png_get_image_height(png_ptr,info_ptr);
      this->_height = uVar6;
      uVar3 = png_get_color_type(png_ptr,info_ptr);
      this->_colorType = uVar3;
      bVar4 = png_get_bit_depth(png_ptr,info_ptr);
      if (bVar4 < 8) {
        if (this->_colorType == '\x03') {
          png_set_packing();
        }
        else {
          png_set_expand(png_ptr);
        }
      }
      else if (bVar4 != 8) {
        png_set_expand(png_ptr);
        png_set_strip_16(png_ptr);
      }
      piVar2 = &this->_transparencySize;
      png_set_interlace_handling(png_ptr);
      png_read_update_info(png_ptr,info_ptr);
      uVar3 = png_get_color_type(png_ptr,info_ptr);
      this->_colorType = uVar3;
      lVar9 = png_get_rowbytes(png_ptr,info_ptr);
      memset(this->_palette,0xff,0x400);
      iVar5 = png_get_PLTE(png_ptr,info_ptr,&palette,piVar1);
      if (iVar5 == 0) {
        *piVar1 = 0;
      }
      else {
        memcpy(this->_palette,palette,(long)*piVar1 * 3);
      }
      iVar5 = png_get_tRNS(png_ptr,info_ptr,&trans_alpha,piVar2,&trans_color);
      if (iVar5 == 0) {
LAB_0016a7ac:
        *piVar2 = 0;
      }
      else if (0 < (long)*piVar2) {
        uVar3 = this->_colorType;
        if (uVar3 == '\x03') {
          memcpy(this->_transparency,trans_alpha,(long)*piVar2);
        }
        else if (uVar3 == '\x02') {
          this->_transparency[0] = '\0';
          this->_transparency[1] = (uchar)trans_color->red;
          this->_transparency[2] = '\0';
          this->_transparency[3] = (uchar)trans_color->green;
          this->_transparency[4] = '\0';
          this->_transparency[5] = (uchar)trans_color->blue;
          this->_transparencySize = 6;
        }
        else {
          if (uVar3 != '\0') goto LAB_0016a7ac;
          this->_transparency[0] = '\0';
          this->_transparency[1] = (uchar)trans_color->gray;
          this->_transparencySize = 2;
        }
      }
      uVar6 = this->_height;
      puVar10 = (uchar *)operator_new__((ulong)(uVar6 * (int)lVar9));
      this->_pixels = puVar10;
      ppuVar11 = (uchar **)operator_new__((ulong)uVar6 << 6);
      this->_rows = ppuVar11;
      uVar12 = 0;
      for (uVar13 = uVar12; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        this->_rows[uVar13] = this->_pixels + (uVar12 & 0xffffffff);
        uVar12 = uVar12 + lVar9;
      }
      png_read_image(png_ptr,this->_rows);
      png_read_end(png_ptr,0);
    }
  }
  png_destroy_read_struct(&png_ptr,&info_ptr,0);
LAB_0016a82f:
  fclose(__stream);
  return;
}

Assistant:

APNGFrame::APNGFrame(const std::string &filePath, unsigned delayNum,
                     unsigned delayDen)
    : _pixels(NULL), _width(0), _height(0), _colorType(0), _paletteSize(0),
      _transparencySize(0), _delayNum(delayNum), _delayDen(delayDen),
      _rows(NULL) {
  // TODO save extracted info to self
  FILE *f;
  if ((f = fopen(filePath.c_str(), "rb")) != 0) {
    unsigned char sig[8];

    if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0) {
      png_structp png_ptr =
          png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
      png_infop info_ptr = png_create_info_struct(png_ptr);
      if (png_ptr && info_ptr) {
        png_byte depth;
        png_uint_32 rowbytes, i;
        png_colorp palette;
        png_color_16p trans_color;
        png_bytep trans_alpha;

        if (setjmp(png_jmpbuf(png_ptr))) {
          png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
          fclose(f);
          return;
        }

        png_init_io(png_ptr, f);
        png_set_sig_bytes(png_ptr, 8);
        png_read_info(png_ptr, info_ptr);
        _width = png_get_image_width(png_ptr, info_ptr);
        _height = png_get_image_height(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        depth = png_get_bit_depth(png_ptr, info_ptr);
        if (depth < 8) {
          if (_colorType == PNG_COLOR_TYPE_PALETTE)
            png_set_packing(png_ptr);
          else
            png_set_expand(png_ptr);
        } else if (depth > 8) {
          png_set_expand(png_ptr);
          png_set_strip_16(png_ptr);
        }
        (void)png_set_interlace_handling(png_ptr);
        png_read_update_info(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        rowbytes = png_get_rowbytes(png_ptr, info_ptr);
        memset(_palette, 255, sizeof(_palette));
        memset(_transparency, 255, sizeof(_transparency));

        if (png_get_PLTE(png_ptr, info_ptr, &palette, &_paletteSize))
          memcpy(_palette, palette, _paletteSize * 3);
        else
          _paletteSize = 0;

        if (png_get_tRNS(png_ptr, info_ptr, &trans_alpha, &_transparencySize,
                         &trans_color)) {
          if (_transparencySize > 0) {
            if (_colorType == PNG_COLOR_TYPE_GRAY) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->gray & 0xFF;
              _transparencySize = 2;
            } else if (_colorType == PNG_COLOR_TYPE_RGB) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->red & 0xFF;
              _transparency[2] = 0;
              _transparency[3] = trans_color->green & 0xFF;
              _transparency[4] = 0;
              _transparency[5] = trans_color->blue & 0xFF;
              _transparencySize = 6;
            } else if (_colorType == PNG_COLOR_TYPE_PALETTE)
              memcpy(_transparency, trans_alpha, _transparencySize);
            else
              _transparencySize = 0;
          }
        } else
          _transparencySize = 0;

        _pixels = new unsigned char[_height * rowbytes];
        _rows = new png_bytep[_height * sizeof(png_bytep)];

        for (i = 0; i < _height; ++i)
          _rows[i] = _pixels + i * rowbytes;

        png_read_image(png_ptr, _rows);
        png_read_end(png_ptr, NULL);
      }
      png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    }
    fclose(f);
  }
}